

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

string * __thiscall
gl4cts::GPUShaderFP64Test6::getTessellationEvaluationShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test6 *this,_test_case *test_case)

{
  ostream *poVar1;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  stringstream result_sstream;
  string local_1d0;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"#version 420\n\nlayout(isolines) in;\n\nvoid main()\n{\n",0x32);
  Utils::getVariableTypeString_abi_cxx11_(&local_1d0,(Utils *)(ulong)test_case->src_type,type);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," src",4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (1 < test_case->src_array_size) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[",1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  }
  pcVar3 = ";\n";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,";\n",2);
  if (test_case->wrap_dst_type_in_structure == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"struct\n{\n",9);
    Utils::getVariableTypeString_abi_cxx11_(&local_1d0,(Utils *)(ulong)test_case->dst_type,type_01);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," member",7);
  }
  else {
    Utils::getVariableTypeString_abi_cxx11_(&local_1d0,(Utils *)(ulong)test_case->dst_type,type_00);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," dst",4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  bVar4 = test_case->wrap_dst_type_in_structure != false;
  if (bVar4) {
    pcVar3 = ";\n} dst;\n";
  }
  lVar2 = 2;
  if (bVar4) {
    lVar2 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"dst = src;\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test6::getTessellationEvaluationShaderBody(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Add preamble */
	result_sstream << "#version 420\n"
					  "\n"
					  "layout(isolines) in;\n"
					  "\n"
					  "void main()\n"
					  "{\n";

	/* Add local variable declarations */
	result_sstream << Utils::getVariableTypeString(test_case.src_type) << " src";

	if (test_case.src_array_size > 1)
	{
		result_sstream << "[" << test_case.src_array_size << "]";
	}

	result_sstream << ";\n";

	if (test_case.wrap_dst_type_in_structure)
	{
		result_sstream << "struct\n"
						  "{\n"
					   << Utils::getVariableTypeString(test_case.dst_type) << " member";
	}
	else
	{
		result_sstream << Utils::getVariableTypeString(test_case.dst_type) << " dst";
	}

	if (test_case.wrap_dst_type_in_structure)
	{
		result_sstream << ";\n"
						  "} dst;\n";
	}
	else
	{
		result_sstream << ";\n";
	}

	/* Continue with the actual body. */
	result_sstream << "dst = src;\n";

	/* Complete the body */
	result_sstream << "}\n";

	/* Return the body */
	return result_sstream.str();
}